

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketTest.cpp
# Opt level: O0

void __thiscall
jaegertracing::net::Socket_testFailListen_Test::TestBody(Socket_testFailListen_Test *this)

{
  bool bVar1;
  byte bVar2;
  int __n;
  AssertHelper local_58 [8];
  Message local_50 [16];
  system_error *anon_var_0;
  char *pcStack_38;
  bool gtest_caught_expected;
  ConstCharPtr gtest_msg;
  undefined1 local_20 [8];
  Socket socket;
  Socket_testFailListen_Test *this_local;
  
  socket._8_8_ = this;
  Socket::Socket((Socket *)local_20);
  Socket::open((Socket *)local_20,(char *)0x2,2);
  testing::internal::ConstCharPtr::ConstCharPtr((ConstCharPtr *)&stack0xffffffffffffffc8,"");
  bVar1 = testing::internal::ConstCharPtr::operator_cast_to_bool
                    ((ConstCharPtr *)&stack0xffffffffffffffc8);
  if (bVar1) {
    anon_var_0._7_1_ = 0;
    bVar2 = testing::internal::AlwaysTrue();
    if ((bVar2 & 1) != 0) {
      Socket::listen((Socket *)local_20,0x80,__n);
    }
    if ((anon_var_0._7_1_ & 1) != 0) {
      anon_var_0._0_4_ = 0;
      goto LAB_002bd24b;
    }
    pcStack_38 = 
    "Expected: socket.listen() throws an exception of type std::system_error.\n  Actual: it throws nothing."
    ;
  }
  testing::Message::Message(local_50);
  testing::internal::AssertHelper::AssertHelper
            (local_58,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/grimmmyshini[P]jaeger-cpp-example/src/jaegertracing/net/SocketTest.cpp"
             ,0x3f,pcStack_38);
  testing::internal::AssertHelper::operator=(local_58,local_50);
  testing::internal::AssertHelper::~AssertHelper(local_58);
  testing::Message::~Message(local_50);
  anon_var_0._0_4_ = 1;
LAB_002bd24b:
  Socket::~Socket((Socket *)local_20);
  return;
}

Assistant:

TEST(Socket, testFailListen)
{
    Socket socket;
    socket.open(AF_INET, SOCK_DGRAM);
    ASSERT_THROW(socket.listen(), std::system_error);
}